

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Column.cpp
# Opt level: O3

void __thiscall SQLite::Column::Column(Column *this,TStatementPtr *aStmtPtr,int aIndex)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  Exception *this_00;
  
  peVar2 = (aStmtPtr->super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->mStmtPtr).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (aStmtPtr->super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->mStmtPtr).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (aStmtPtr->super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->mIndex = aIndex;
  if (peVar2 != (element_type *)0x0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,"Statement was destroyed",-1);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Column::Column(const Statement::TStatementPtr& aStmtPtr, int aIndex) :
    mStmtPtr(aStmtPtr),
    mIndex(aIndex)
{
    if (!aStmtPtr)
    {
        throw SQLite::Exception("Statement was destroyed");
    }
}